

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

RTPTransmissionInfo * __thiscall
jrtplib::RTPExternalTransmitter::GetTransmissionInfo(RTPExternalTransmitter *this)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *tinf;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local = (RTPExternalTransmitter *)0x0;
  }
  else {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    this_local = (RTPExternalTransmitter *)operator_new(0x18,mgr,0x1c);
    RTPExternalTransmissionInfo::RTPExternalTransmissionInfo
              ((RTPExternalTransmissionInfo *)this_local,&this->packetinjector);
  }
  return (RTPTransmissionInfo *)this_local;
}

Assistant:

RTPTransmissionInfo *RTPExternalTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPExternalTransmissionInfo(&packetinjector);
	MAINMUTEX_UNLOCK
	return tinf;
}